

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

void __thiscall slang::ast::EvalContext::pushEmptyFrame(EvalContext *this)

{
  Frame local_68;
  EvalContext *local_10;
  EvalContext *this_local;
  
  local_68.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68.temporaries._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_68.temporaries._M_t._M_impl._0_8_ = 0;
  local_68.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.temporaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_10 = this;
  std::
  map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  ::map(&local_68.temporaries);
  local_68.subroutine = (SubroutineSymbol *)0x0;
  SourceLocation::SourceLocation(&local_68.callLocation);
  local_68.lookupLocation.scope = (Scope *)0x0;
  local_68.lookupLocation.index = 0;
  local_68.lookupLocation._12_4_ = 0;
  LookupLocation::LookupLocation(&local_68.lookupLocation);
  SmallVectorBase<slang::ast::EvalContext::Frame>::emplace_back<slang::ast::EvalContext::Frame>
            (&(this->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>,&local_68);
  Frame::~Frame(&local_68);
  return;
}

Assistant:

void EvalContext::pushEmptyFrame() {
    stack.emplace_back(Frame{});
}